

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::string_maker<int>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,string_maker<int> *this,int *value)

{
  uint *puVar1;
  ostringstream os;
  string local_1b0 [32];
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::operator<<((ostream *)local_190,*(int *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_1b0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }